

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

string_view __thiscall csv::CSVRow::get_field(CSVRow *this,size_t index)

{
  long lVar1;
  element_type *peVar2;
  tuple<csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_> tVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  undefined8 uVar6;
  ulong uVar7;
  _Elt_pointer puVar8;
  ulong uVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pcVar14;
  string_view sVar15;
  size_t field_index;
  ulong local_38;
  
  if (this->row_length <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Index out of bounds.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_38 = index + this->fields_start;
  peVar2 = (this->data).super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  uVar13 = (peVar2->fields)._single_buffer_capacity;
  puVar8 = ((iterator *)
           ((long)&(peVar2->fields).buffers.
                   super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                   ._M_impl + 0x10))->_M_cur;
  uVar9 = local_38 % uVar13;
  if (local_38 < uVar13) {
    uVar9 = local_38;
  }
  uVar7 = ((long)puVar8 -
           (long)*(_Elt_pointer *)
                  ((long)&(peVar2->fields).buffers.
                          super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                          ._M_impl + 0x18) >> 3) + local_38 / uVar13;
  if (uVar7 < 0x40) {
    puVar8 = puVar8 + local_38 / uVar13;
  }
  else {
    uVar13 = uVar7 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar7) {
      uVar13 = uVar7 >> 6;
    }
    puVar8 = (*(_Map_pointer *)
               ((long)&(peVar2->fields).buffers.
                       super__Deque_base<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>,_std::allocator<std::unique_ptr<csv::internals::RawCSVField[],_std::default_delete<csv::internals::RawCSVField[]>_>_>_>
                       ._M_impl + 0x28))[uVar13] + uVar7 + uVar13 * -0x40;
  }
  tVar3.
  super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
  .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl =
       (puVar8->_M_t).
       super___uniq_ptr_impl<csv::internals::RawCSVField,_std::default_delete<csv::internals::RawCSVField[]>_>
       ._M_t.
       super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
  ;
  uVar13 = (peVar2->data)._M_len;
  uVar12 = *(long *)((long)tVar3.
                           super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                           .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl
                    + uVar9 * 0x18) + this->data_start;
  uVar7 = uVar13 - uVar12;
  if (uVar12 <= uVar13) {
    lVar1 = (long)tVar3.
                  super__Tuple_impl<0UL,_csv::internals::RawCSVField_*,_std::default_delete<csv::internals::RawCSVField[]>_>
                  .super__Head_base<0UL,_csv::internals::RawCSVField_*,_false>._M_head_impl +
            uVar9 * 0x18;
    pcVar4 = (peVar2->data)._M_str;
    if (*(char *)(lVar1 + 0x10) == '\x01') {
      pmVar5 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&peVar2->double_quote_fields,&local_38);
      if ((pmVar5->_M_string_length == 0) && (*(long *)(lVar1 + 8) != 0)) {
        uVar13 = 0;
        bVar10 = false;
        do {
          bVar11 = bVar10;
          if (((((this->data).
                 super___shared_ptr<csv::internals::RawCSVData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->parse_flags)._M_elems[(int)pcVar4[uVar13 + uVar12] + 0x80] == QUOTE) &&
             (bVar11 = true, bVar10)) {
            bVar10 = false;
          }
          else {
            std::__cxx11::string::push_back((char)pmVar5);
            bVar10 = bVar11;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 < *(ulong *)(lVar1 + 8));
      }
      pcVar14 = (pmVar5->_M_dataplus)._M_p;
      uVar13 = pmVar5->_M_string_length;
    }
    else {
      pcVar14 = pcVar4 + uVar12;
      uVar13 = *(ulong *)(lVar1 + 8);
      if (uVar7 < *(ulong *)(lVar1 + 8)) {
        uVar13 = uVar7;
      }
    }
    sVar15._M_str = pcVar14;
    sVar15._M_len = uVar13;
    return sVar15;
  }
  uVar6 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar12);
  __cxa_free_exception(this);
  _Unwind_Resume(uVar6);
}

Assistant:

CSV_INLINE csv::string_view CSVRow::get_field(size_t index) const
    {
        using internals::ParseFlags;

        if (index >= this->size())
            throw std::runtime_error("Index out of bounds.");

        const size_t field_index = this->fields_start + index;
        auto& field = this->data->fields[field_index];
        auto field_str = csv::string_view(this->data->data).substr(this->data_start + field.start);

        if (field.has_double_quote) {
            auto& value = this->data->double_quote_fields[field_index];
            if (value.empty()) {
                bool prev_ch_quote = false;
                for (size_t i = 0; i < field.length; i++) {
                    if (this->data->parse_flags[field_str[i] + 128] == ParseFlags::QUOTE) {
                        if (prev_ch_quote) {
                            prev_ch_quote = false;
                            continue;
                        }
                        else {
                            prev_ch_quote = true;
                        }
                    }

                    value += field_str[i];
                }
            }

            return csv::string_view(value);
        }

        return field_str.substr(0, field.length);
    }